

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Farm.cpp
# Opt level: O0

void __thiscall Farm::editBasket(Farm *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  reference pBVar4;
  reference this_00;
  double dVar5;
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [32];
  double local_1b0;
  double weight;
  function<bool_(int)> local_1a0;
  allocator local_179;
  string local_178 [32];
  undefined1 local_158 [8];
  Basket b;
  iterator __end1;
  iterator __begin1;
  vector<Basket,_std::allocator<Basket>_> *__range1;
  int i;
  allocator local_101;
  string local_100 [32];
  _Node_iterator_base<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false>
  local_e0;
  _Node_iterator_base<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false>
  local_d8;
  _Node_iterator_base<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false>
  *local_d0;
  iterator *cb_pair;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  anon_class_1_0_00000001 local_71;
  function<bool_(int)> local_70;
  allocator local_39;
  string local_38 [36];
  int local_14;
  Farm *pFStack_10;
  int nif;
  Farm *this_local;
  
  pFStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Enter client\'s nif: ",&local_39);
  std::function<bool(int)>::function<__0,void>((function<bool(int)> *)&local_70,&local_71);
  getOption(&local_14,(string *)local_38,&local_70);
  std::function<bool_(int)>::~function(&local_70);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  bVar1 = searchClientByNIF(this,local_14);
  if (bVar1) {
    local_d8._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::vector<Basket,_std::allocator<Basket>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>_>_>
         ::find(&this->baskets,&local_14);
    local_d0 = &local_d8;
    local_e0._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::vector<Basket,_std::allocator<Basket>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>_>_>
         ::end(&this->baskets);
    bVar1 = std::__detail::operator==(&local_d8,&local_e0);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_100,"Client doesn\'t have any active baskets to delivery!",&local_101);
      cinERR((string *)local_100);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&i,"ENTER to go back",(allocator *)((long)&__range1 + 7));
      enterWait((string *)&i);
      std::__cxx11::string::~string((string *)&i);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    }
    else {
      line(0x14,'-');
      poVar2 = std::operator<<((ostream *)&std::cout,"Client\'s baskets:");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      line(0x14,'-');
      __range1._0_4_ = 0;
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false,_false>
                             *)local_d0);
      __end1 = std::vector<Basket,_std::allocator<Basket>_>::begin(&ppVar3->second);
      b._8_8_ = std::vector<Basket,_std::allocator<Basket>_>::end(&ppVar3->second);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<Basket_*,_std::vector<Basket,_std::allocator<Basket>_>_>
                                    *)&b.client_nif);
        if (!bVar1) break;
        pBVar4 = __gnu_cxx::
                 __normal_iterator<Basket_*,_std::vector<Basket,_std::allocator<Basket>_>_>::
                 operator*(&__end1);
        local_158 = (undefined1  [8])pBVar4->weight;
        b.weight = *(double *)&pBVar4->client_nif;
        __range1._0_4_ = (int)__range1 + 1;
        poVar2 = std::operator<<((ostream *)&std::cout,"ID: ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)__range1);
        poVar2 = std::operator<<(poVar2," | Weight: ");
        dVar5 = Basket::getWeight((Basket *)local_158);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar5);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        __gnu_cxx::__normal_iterator<Basket_*,_std::vector<Basket,_std::allocator<Basket>_>_>::
        operator++(&__end1);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_178,"Enter ID of the basket to be edited: ",&local_179);
      weight = (double)&__range1;
      std::function<bool(int)>::function<Farm::editBasket()::__0,void>
                ((function<bool(int)> *)&local_1a0,(anon_class_8_1_54a39809 *)&weight);
      getOption(&local_14,(string *)local_178,&local_1a0);
      std::function<bool_(int)>::~function(&local_1a0);
      std::__cxx11::string::~string(local_178);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d0,"Enter basket\'s new weight: ",&local_1d1);
      getDouble(&local_1b0,(string *)local_1d0);
      std::__cxx11::string::~string(local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false,_false>
                             *)local_d0);
      this_00 = std::vector<Basket,_std::allocator<Basket>_>::at(&ppVar3->second,(long)local_14);
      Basket::setWeight(this_00,local_1b0);
      this->clientsFileChanged = true;
      poVar2 = std::operator<<((ostream *)&std::cout,"Basket successfully edited!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f8,"ENTER to go back",&local_1f9);
      enterWait((string *)local_1f8);
      std::__cxx11::string::~string(local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_98,
               "ERROR: Doesn\'t exists a client with the given nif, please create a new one!",
               &local_99);
    cinERR((string *)local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"ENTER to go back",(allocator *)((long)&cb_pair + 7));
    enterWait((string *)local_c0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cb_pair + 7));
  }
  return;
}

Assistant:

void Farm::editBasket() {
    int nif;

    getOption(nif, "Enter client's nif: ");
    if(!searchClientByNIF(nif)){
        cinERR("ERROR: Doesn't exists a client with the given nif, please create a new one!");
        enterWait();
        return;
    }

    const auto& cb_pair = baskets.find(nif);
    if(cb_pair == baskets.end()){
        cinERR("Client doesn't have any active baskets to delivery!");
        enterWait();
        return;
    }

    line(20);
    cout << "Client's baskets:" << endl;
    line(20);

    int i=0;
    for(Basket b: cb_pair->second){
        i++;
        cout << "ID: " << i << " | Weight: " << b.getWeight() << endl;
    }

    getOption(nif, "Enter ID of the basket to be edited: ", [&](int a){ return a > 0 && a < i; });

    double weight;
    getDouble(weight, "Enter basket's new weight: ");
    cb_pair->second.at(nif).setWeight(weight);

    clientsFileChanged = true;
    cout << "Basket successfully edited!" << endl;
    enterWait();
}